

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::~IfcOrientedEdge(IfcOrientedEdge *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  plVar1 = (long *)((this->Orientation).field_2._M_local_buf + (long)p_Var2);
  plVar1[-0xd] = 0x90f668;
  plVar1[2] = 0x90f708;
  plVar1[-0xb] = 0x90f690;
  plVar1[-9] = 0x90f6b8;
  plVar1[-5] = 0x90f6e0;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
                          super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2),0x90);
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}